

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PDFReader.cpp
# Opt level: O1

Barcode * __thiscall
ZXing::Pdf417::Reader::decode(Barcode *__return_storage_ptr__,Reader *this,BinaryBitmap *image)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pEVar3;
  void *pvVar4;
  undefined1 auVar5 [16];
  char cVar6;
  BitMatrixCursor<ZXing::PointT<double>_> topCur;
  BitMatrixCursor<ZXing::PointT<double>_> topCur_00;
  SymbolInfo info;
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  BitMatrix *this_00;
  SymbolInfo *pSVar10;
  int __tmp;
  uint uVar11;
  int iVar12;
  float fVar13;
  uint uVar14;
  float fVar15;
  uint uVar16;
  uint uVar17;
  float fVar18;
  double dVar19;
  double dVar20;
  int height;
  int width;
  int top;
  int left;
  vector<int,_std::allocator<int>_> codeWords;
  DecoderResult res;
  uint local_21c;
  uint local_218;
  uint local_214;
  uint local_210;
  uint local_20c;
  BinaryBitmap *local_208;
  ulong local_200;
  vector<int,_std::allocator<int>_> local_1f8;
  pointer local_1e0;
  int iStack_1d8;
  int iStack_1d4;
  int iStack_1d0;
  int iStack_1cc;
  pointer pEStack_1c8;
  float local_1c0;
  double local_1b8;
  double dStack_1b0;
  BitMatrix *local_1a8;
  BitMatrix *pBVar21;
  double dVar22;
  double dVar23;
  float fVar24;
  uint uVar25;
  float fVar26;
  uint uVar27;
  float fVar28;
  undefined1 local_148 [40];
  pointer local_120;
  _Alloc_hider local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_100 [2];
  _Alloc_hider local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d0;
  _Alloc_hider local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a8 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_80;
  undefined1 local_78 [16];
  undefined1 local_68 [24];
  PointT<int> local_50;
  PointT<int> local_48;
  PointT<int> local_40;
  
  if ((undefined1  [12])((undefined1  [12])*(this->super_Reader)._opts & (undefined1  [12])0x10) !=
      (undefined1  [12])0x0) {
    this_00 = BinaryBitmap::getBitMatrix(image);
    if (((this_00 == (BitMatrix *)0x0) ||
        (bVar8 = BitMatrix::findBoundingBox
                           (this_00,(int *)&local_210,(int *)&local_214,(int *)&local_218,
                            (int *)&local_21c,9), !bVar8)) ||
       ((int)local_21c < 0x33 && (int)local_218 < 0x33)) {
      memset(__return_storage_ptr__,0,0xd8);
      Result::Result(__return_storage_ptr__);
    }
    else {
      local_20c = (local_218 + local_210) - 1;
      local_200 = (ulong)((local_21c - 1) + local_214);
      dVar19 = (double)(int)local_210 + 0.5;
      dVar20 = (double)(int)local_214 + 0.5;
      iVar12 = 4;
      fVar15 = 0.0;
      uVar17 = 0x3ff00000;
      fVar18 = 0.0;
      uVar14 = 0;
      uVar11 = local_214;
      local_208 = image;
      do {
        uVar16 = uVar17;
        topCur.d.y._4_4_ = uVar14;
        topCur.d.y._0_4_ = fVar18;
        topCur.d.x._4_4_ = uVar16;
        topCur.d.x._0_4_ = fVar15;
        topCur.p.x = dVar19;
        topCur.img = this_00;
        topCur.p.y = dVar20;
        local_1b8 = dVar19;
        dStack_1b0 = dVar20;
        pBVar21 = this_00;
        dVar22 = dVar19;
        dVar23 = dVar20;
        fVar24 = fVar15;
        uVar25 = uVar16;
        fVar26 = fVar18;
        uVar27 = uVar14;
        fVar28 = fVar15;
        pSVar10 = DetectSymbol<ZXing::PointT<double>>
                            ((SymbolInfo *)local_148,(Pdf417 *)(ulong)local_218,topCur,local_21c,
                             uVar11);
        uVar11 = local_218;
        auVar7._8_4_ = fVar18;
        auVar7._0_8_ = CONCAT44(uVar16,fVar28);
        auVar7._12_4_ = uVar14;
        cVar6 = (char)local_148._24_8_;
        auVar5._4_4_ = -(uint)(2 < (int)local_148._8_4_);
        auVar5._0_4_ = -(uint)(2 < (int)local_148._8_4_);
        auVar5._8_4_ = -(uint)(0 < (int)local_148._12_4_);
        auVar5._12_4_ = -(uint)(0 < (int)local_148._12_4_);
        iVar9 = movmskpd((int)pSVar10,auVar5);
        bVar8 = (int)local_148._24_8_ != -1;
        fVar13 = fVar18;
        fVar15 = fVar28;
        uVar17 = uVar16;
        dVar19 = local_1b8;
        dVar20 = dStack_1b0;
        if (bVar8 && iVar9 == 3) break;
        dVar19 = local_1b8 + (double)(int)(local_218 - 1) * (double)CONCAT44(uVar16,fVar28);
        dVar20 = dStack_1b0 + (double)(int)(local_218 - 1) * auVar7._8_8_;
        uVar17 = uVar14 ^ 0x80000000;
        local_218 = local_21c;
        local_21c = uVar11;
        iVar12 = iVar12 + -1;
        fVar13 = fVar28;
        uVar14 = uVar16;
        fVar15 = fVar18;
        fVar18 = fVar28;
      } while (iVar12 != 0);
      if (bVar8 && iVar9 == 3) {
        topCur_00.p.y._4_4_ = uVar17;
        topCur_00.p.y._0_4_ = fVar15;
        topCur_00.d.x._4_4_ = uVar14;
        topCur_00.d.x._0_4_ = fVar13;
        local_1e0 = (pointer)local_148._0_8_;
        iStack_1d8 = local_148._8_4_;
        iStack_1d4 = local_148._12_4_;
        iStack_1d0 = local_148._16_4_;
        iStack_1cc = local_148._20_4_;
        pEStack_1c8 = (pointer)local_148._24_8_;
        local_1c0 = (float)local_148._32_4_;
        topCur_00.p.x = dVar20;
        topCur_00.img = (BitMatrix *)dVar19;
        topCur_00.d.y = (double)pBVar21;
        info._8_8_ = dVar23;
        info._0_8_ = dVar22;
        info.firstRow = (int)fVar24;
        info.lastRow = uVar25;
        info.ecLevel = (int)fVar26;
        info.colWidth = uVar27;
        info.rowHeight = fVar28;
        local_1a8 = this_00;
        ReadCodeWords<ZXing::PointT<double>>(topCur_00,info);
        DecodeCodewords((DecoderResult *)local_148,&local_1f8,1 << (cVar6 + 1U & 0x1f));
        local_50.y = local_214;
        local_50.x = local_20c;
        local_48 = (PointT<int>)((ulong)local_20c | local_200 << 0x20);
        local_40 = (PointT<int>)(local_200 << 0x20 | (ulong)local_210);
        local_78 = (undefined1  [16])0x0;
        local_68._0_16_ = (undefined1  [16])0x0;
        Result::Result(__return_storage_ptr__,(DecoderResult *)local_148,(DetectorResult *)local_78,
                       PDF417);
        image = local_208;
        if ((pointer)local_78._8_8_ != (pointer)0x0) {
          operator_delete((void *)local_78._8_8_,local_68._8_8_ - local_78._8_8_);
        }
        if (local_80._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_80._M_pi);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_p != local_a8) {
          operator_delete(local_b8._M_p,local_a8[0]._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_e0._M_p != &local_d0) {
          operator_delete(local_e0._M_p,local_d0._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_110._M_p != local_100) {
          operator_delete(local_110._M_p,local_100[0]._M_allocated_capacity + 1);
        }
        if ((pointer)local_148._24_8_ != (pointer)0x0) {
          operator_delete((void *)local_148._24_8_,(long)local_120 - local_148._24_8_);
        }
        if ((pointer)local_148._0_8_ != (pointer)0x0) {
          operator_delete((void *)local_148._0_8_,
                          CONCAT44(local_148._20_4_,local_148._16_4_) - local_148._0_8_);
        }
        if (local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start != (pointer)0x0) {
          operator_delete(local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage -
                          (long)local_1f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_start);
        }
      }
      else {
        memset(__return_storage_ptr__,0,0xd8);
        Result::Result(__return_storage_ptr__);
        image = local_208;
      }
    }
    if ((__return_storage_ptr__->_error)._type != Checksum) {
      return __return_storage_ptr__;
    }
    pcVar2 = (__return_storage_ptr__->_sai).id._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->_sai).id.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    pcVar2 = (__return_storage_ptr__->_error)._msg._M_dataplus._M_p;
    paVar1 = &(__return_storage_ptr__->_error)._msg.field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)pcVar2 != paVar1) {
      operator_delete(pcVar2,paVar1->_M_allocated_capacity + 1);
    }
    pEVar3 = (__return_storage_ptr__->_content).encodings.
             super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (pEVar3 != (pointer)0x0) {
      operator_delete(pEVar3,(long)(__return_storage_ptr__->_content).encodings.
                                   super__Vector_base<ZXing::Content::Encoding,_std::allocator<ZXing::Content::Encoding>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pEVar3
                     );
    }
    pvVar4 = (__return_storage_ptr__->_content).bytes.
             super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (pvVar4 != (void *)0x0) {
      operator_delete(pvVar4,(long)(__return_storage_ptr__->_content).bytes.
                                   super_vector<unsigned_char,_std::allocator<unsigned_char>_>.
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar4
                     );
    }
  }
  uVar11 = *(uint *)(this->super_Reader)._opts;
  DoDecode((Barcodes *)local_148,image,false,SUB41((uVar11 & 2) >> 1,0),
           (bool)((byte)(uVar11 >> 9) & 1));
  FirstOrDefault<std::vector,_ZXing::Result,_std::allocator<ZXing::Result>_>
            (__return_storage_ptr__,(Barcodes *)local_148);
  std::vector<ZXing::Result,_std::allocator<ZXing::Result>_>::~vector
            ((vector<ZXing::Result,_std::allocator<ZXing::Result>_> *)local_148);
  return __return_storage_ptr__;
}

Assistant:

Barcode
Reader::decode(const BinaryBitmap& image) const
{
	if (_opts.isPure()) {
		auto res = DecodePure(image);
		if (res.error() != Error::Checksum)
			return res;
		// This falls through and tries the non-pure code path if we have a checksum error. This approach is
		// currently the best option to deal with 'aliased' input like e.g. 03-aliased.png
	}
	
	return FirstOrDefault(DoDecode(image, false, _opts.tryRotate(), _opts.returnErrors()));
}